

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

void generateRandomString(char *str,size_t size)

{
  int iVar1;
  time_t tVar2;
  size_t n;
  long lVar3;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  if (size != 0) {
    for (lVar3 = 0; size - 1 != lVar3; lVar3 = lVar3 + 1) {
      iVar1 = rand();
      str[lVar3] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789"[iVar1 % 0x3e];
    }
  }
  return;
}

Assistant:

void
generateRandomString(char* str, size_t size)  // size_t: type able to represent the size of any object in bytes
{

    const char charset[] =  "ABCDEFGHIJKLMNOPQRSTUVWXYZ"
                            "abcdefghijklmnopqrstuvwxyz"
                            "0123456789";                       // side note: the characters "." and "/" are also allowed as arguments of `crypt()`,
                                                                //            however they're not included in this list because the reservation code
                                                                //            -- that uses this function -- has to be an alphanumeric string.

    // init random number generator
    srand(time(NULL));
    

    if (size) {
        --size;
        for (size_t n = 0; n < size; n++) {
            int key = rand() % (int) (sizeof charset - 1);
            str[n] = charset[key];
        }
        // str[size] = '\0';
    }
    return;
}